

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

uint32_t phmap::priv::LeadingZeros<unsigned_int>(uint x)

{
  uint uVar1;
  uint32_t res;
  uint x_local;
  
  if (x == 0) {
    x_local = 0x20;
  }
  else {
    uVar1 = 0x1f;
    if (x != 0) {
      for (; x >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    x_local = uVar1 ^ 0x1f;
  }
  return x_local;
}

Assistant:

uint32_t LeadingZeros(T x) {
    uint32_t res;
    PHMAP_IF_CONSTEXPR(sizeof(T) == 8)
        res = base_internal::CountLeadingZeros64(static_cast<uint64_t>(x));
    else
        res = base_internal::CountLeadingZeros32(static_cast<uint32_t>(x));
    return res;
}